

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O1

int synchnet(curl_socket_t f)

{
  int iVar1;
  int i;
  curl_socklen_t fromaddrlen;
  srvr_sockaddr_union_t fromaddr;
  char rbuf [516];
  int local_2b0;
  socklen_t local_2ac;
  sockaddr local_2a8 [7];
  undefined1 local_238 [520];
  
  iVar1 = ioctl(f,0x541b,&local_2b0);
  if (local_2b0 != 0) {
    do {
      local_2ac = 0x10;
      if (use_ipv6 != '\0') {
        local_2ac = 0x1c;
      }
      recvfrom(f,local_238,0x204,0,local_2a8,&local_2ac);
      iVar1 = ioctl(f,0x541b,&local_2b0);
    } while (local_2b0 != 0);
  }
  return iVar1;
}

Assistant:

static int synchnet(curl_socket_t f /* socket to flush */)
{

#if defined(HAVE_IOCTLSOCKET)
  unsigned long i;
#else
  int i;
#endif
  int j = 0;
  char rbuf[PKTSIZE];
  srvr_sockaddr_union_t fromaddr;
  curl_socklen_t fromaddrlen;

  for(;;) {
#if defined(HAVE_IOCTLSOCKET)
    (void) ioctlsocket(f, FIONREAD, &i);
#else
    (void) ioctl(f, FIONREAD, &i);
#endif
    if(i) {
      j++;
#ifdef ENABLE_IPV6
      if(!use_ipv6)
#endif
        fromaddrlen = sizeof(fromaddr.sa4);
#ifdef ENABLE_IPV6
      else
        fromaddrlen = sizeof(fromaddr.sa6);
#endif
      (void) recvfrom(f, rbuf, sizeof(rbuf), 0,
                      &fromaddr.sa, &fromaddrlen);
    }
    else
      break;
  }
  return j;
}